

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reldtfmt.cpp
# Opt level: O2

void __thiscall icu_63::RelativeDateFormat::loadDates(RelativeDateFormat *this,UErrorCode *status)

{
  uint uVar1;
  int32_t iVar2;
  char *localeID;
  UResourceBundle *resB;
  UChar *s1;
  SimpleFormatter *this_00;
  UDateFormatStyle UVar3;
  ulong uVar4;
  ulong uVar5;
  undefined6 *size;
  int32_t resStrLen;
  LocalUResourceBundlePointer dateTimePatterns;
  ConstChar16Ptr local_80;
  UChar *local_78;
  RelDateFmtDataSink sink;
  
  localeID = Locale::getBaseName(&this->fLocale);
  resB = ures_open_63((char *)0x0,localeID,status);
  dateTimePatterns.super_LocalPointerBase<UResourceBundle>.ptr =
       (LocalPointerBase<UResourceBundle>)
       ures_getByKeyWithFallback_63
                 (resB,"calendar/gregorian/DateTimePatterns",(UResourceBundle *)0x0,status);
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
     (uVar1 = ures_getSize_63((UResourceBundle *)
                              dateTimePatterns.super_LocalPointerBase<UResourceBundle>.ptr),
     8 < (int)uVar1)) {
    resStrLen = 0;
    if (uVar1 < 0xd) {
      size = (undefined6 *)0x8;
    }
    else {
      UVar3 = this->fDateStyle & ~UDAT_FULL_RELATIVE;
      size = (undefined6 *)(ulong)(uint)(UVar3 + 9);
      if (UDAT_SHORT_RELATIVE < UVar3) {
        size = (undefined6 *)0x8;
      }
      if (this->fDateStyle < UDAT_FULL) {
        size = (undefined6 *)0x8;
      }
    }
    s1 = ures_getStringByIndex_63
                   ((UResourceBundle *)dateTimePatterns.super_LocalPointerBase<UResourceBundle>.ptr,
                    (int32_t)size,&resStrLen,status);
    if ((*status < U_ILLEGAL_ARGUMENT_ERROR) && (2 < resStrLen)) {
      size = &patItem1;
      iVar2 = u_strncmp_63(s1,
                           L"{1}㙎捩彵㌶㠱敒慬楴敶慄整潆浲瑡E㙎捩彵㌶㈱䝟佌䅂彌也ㅟ㠱敒䑬瑡䙥瑭慄慴楓歮Eother"
                           ,3);
      if (iVar2 == 0) {
        this->fCombinedHasDateAtStart = '\x01';
      }
    }
    this_00 = (SimpleFormatter *)UMemory::operator_new((UMemory *)0x48,(size_t)size);
    if (this_00 == (SimpleFormatter *)0x0) {
      this->fCombinedFormat = (SimpleFormatter *)0x0;
    }
    else {
      local_80.p_ = s1;
      icu_63::UnicodeString::UnicodeString((UnicodeString *)&sink,'\x01',&local_80,resStrLen);
      SimpleFormatter::SimpleFormatter(this_00,(UnicodeString *)&sink,2,2,status);
      this->fCombinedFormat = this_00;
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)&sink);
      local_78 = local_80.p_;
    }
  }
  this->fDatesLen = 6;
  sink.fDatesPtr = (URelativeString *)uprv_malloc_63(0x60);
  this->fDates = sink.fDatesPtr;
  sink.fDatesLen = this->fDatesLen;
  sink.super_ResourceSink.super_UObject._vptr_UObject = (UObject)&PTR__ResourceSink_00465e00;
  uVar5 = 0;
  uVar4 = (ulong)(uint)sink.fDatesLen;
  if (sink.fDatesLen < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 * 0x10 != uVar5; uVar5 = uVar5 + 0x10) {
    *(undefined8 *)((long)&(sink.fDatesPtr)->offset + uVar5) = 0xffffffff00000000;
    *(undefined8 *)((long)&(sink.fDatesPtr)->string + uVar5) = 0;
  }
  ures_getAllItemsWithFallback_63(resB,"fields/day/relative",&sink.super_ResourceSink,status);
  ures_close_63(resB);
  if (U_ZERO_ERROR < *status) {
    this->fDatesLen = 0;
  }
  ResourceSink::~ResourceSink(&sink.super_ResourceSink);
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&dateTimePatterns);
  return;
}

Assistant:

void RelativeDateFormat::loadDates(UErrorCode &status) {
    UResourceBundle *rb = ures_open(NULL, fLocale.getBaseName(), &status);
    LocalUResourceBundlePointer dateTimePatterns(
        ures_getByKeyWithFallback(rb,
                                  "calendar/gregorian/DateTimePatterns",
                                  (UResourceBundle*)NULL, &status));
    if(U_SUCCESS(status)) {
        int32_t patternsSize = ures_getSize(dateTimePatterns.getAlias());
        if (patternsSize > kDateTime) {
            int32_t resStrLen = 0;
            int32_t glueIndex = kDateTime;
            if (patternsSize >= (kDateTimeOffset + kShort + 1)) {
                int32_t offsetIncrement = (fDateStyle & ~kRelative); // Remove relative bit.
                if (offsetIncrement >= (int32_t)kFull &&
                    offsetIncrement <= (int32_t)kShortRelative) {
                    glueIndex = kDateTimeOffset + offsetIncrement;
                }
            }

            const UChar *resStr = ures_getStringByIndex(dateTimePatterns.getAlias(), glueIndex, &resStrLen, &status);
            if (U_SUCCESS(status) && resStrLen >= patItem1Len && u_strncmp(resStr,patItem1,patItem1Len)==0) {
                fCombinedHasDateAtStart = TRUE;
            }
            fCombinedFormat = new SimpleFormatter(UnicodeString(TRUE, resStr, resStrLen), 2, 2, status);
        }
    }

    // Data loading for relative names, e.g., "yesterday", "today", "tomorrow".
    fDatesLen = UDAT_DIRECTION_COUNT; // Maximum defined by data.
    fDates = (URelativeString*) uprv_malloc(sizeof(fDates[0])*fDatesLen);

    RelDateFmtDataSink sink(fDates, fDatesLen);
    ures_getAllItemsWithFallback(rb, "fields/day/relative", sink, status);

    ures_close(rb);

    if(U_FAILURE(status)) {
        fDatesLen=0;
        return;
    }
}